

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

QDataStream * operator<<(QDataStream *out,QHostAddress *address)

{
  QHostAddressPrivate *pQVar1;
  int i;
  long lVar2;
  long in_FS_OFFSET;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  quint32 local_38;
  quint32 qStack_34;
  quint32 qStack_30;
  quint32 qStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator<<(out,(int)((address->d).d.ptr)->protocol);
  pQVar1 = (address->d).d.ptr;
  if (pQVar1->protocol == '\x01') {
    local_38 = (pQVar1->field_1).a6_32.c[0];
    qStack_34 = (pQVar1->field_1).a6_32.c[1];
    qStack_30 = (pQVar1->field_1).a6_32.c[2];
    qStack_2c = (pQVar1->field_1).a6_32.c[3];
    lVar2 = 0;
    do {
      QDataStream::operator<<(out,(int)*(char *)((long)&local_38 + lVar2));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    pQVar1 = (address->d).d.ptr;
    if (pQVar1->protocol == '\x01') {
      local_58 = &((pQVar1->scopeId).d.d)->super_QArrayData;
      pcStack_50 = (pQVar1->scopeId).d.ptr;
      local_48 = (pQVar1->scopeId).d.size;
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_58 = (QArrayData *)0x0;
      pcStack_50 = (char16_t *)0x0;
      local_48 = 0;
    }
    operator<<(out,(QString *)&local_58);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  else if (pQVar1->protocol == '\0') {
    QDataStream::operator<<(out,pQVar1->a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return out;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QHostAddress &address)
{
    qint8 prot;
    prot = qint8(address.protocol());
    out << prot;
    switch (address.protocol()) {
    case QHostAddress::UnknownNetworkLayerProtocol:
    case QHostAddress::AnyIPProtocol:
        break;
    case QHostAddress::IPv4Protocol:
        out << address.toIPv4Address();
        break;
    case QHostAddress::IPv6Protocol:
    {
        Q_IPV6ADDR ipv6 = address.toIPv6Address();
        for (int i = 0; i < 16; ++i)
            out << ipv6[i];
        out << address.scopeId();
    }
        break;
    }
    return out;
}